

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

NodeIterator
Indexing::RetrievalAlgorithms::
UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>
          (IntermediateNode *n,AbstractingUnifier *unif,uint normInternalBank)

{
  anon_class_24_2_fa5da250_for__func f;
  bool bVar1;
  SymbolId *pSVar2;
  AbstractingUnifier *in_RDX;
  long *in_RSI;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *in_RDI;
  Top TVar3;
  Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_> syms
  ;
  Top top;
  uint specVar;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
  *this;
  Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffdb8;
  undefined1 local_1e0 [8];
  uint in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  RobSubstitution *in_stack_fffffffffffffe30;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
  *it;
  uint in_stack_fffffffffffffe6c;
  RobSubstitution *in_stack_fffffffffffffe70;
  IntermediateNode *in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe90 [16];
  AbstractingUnifier *in_stack_fffffffffffffea0;
  SymbolId in_stack_fffffffffffffea8;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
  local_150 [3];
  SymbolId local_80;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
  *local_40;
  undefined4 local_38;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
  *local_30;
  undefined4 local_28;
  undefined4 local_20;
  long *local_10;
  
  local_10 = in_RSI;
  bVar1 = Kernel::AbstractingUnifier::usesUwa(in_RDX);
  if (bVar1) {
    local_20 = (undefined4)local_10[2];
    Kernel::AbstractingUnifier::subs((AbstractingUnifier *)0x411658);
    TVar3 = Kernel::RobSubstitution::getSpecialVarTop
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                      );
    local_40 = TVar3._inner._inner._0_8_;
    local_38 = CONCAT31(local_38._1_3_,TVar3._inner._inner._content[7]);
    local_28 = local_38;
    local_30 = local_40;
    Kernel::TermList::Top::var((Top *)in_stack_fffffffffffffdb8);
    bVar1 = Lib::Option::operator_cast_to_bool((Option<Kernel::VarNumber> *)0x4116bf);
    Lib::Option<Kernel::VarNumber>::~Option((Option<Kernel::VarNumber> *)0x4116d2);
    if (bVar1) {
      (**(code **)(*local_10 + 0x40))(in_RDI);
    }
    else {
      Kernel::TermList::Top::functor((Top *)in_stack_fffffffffffffdb8);
      pSVar2 = Lib::Option<Kernel::SymbolId>::operator*((Option<Kernel::SymbolId> *)0x41174b);
      local_80 = *pSVar2;
      Kernel::AbstractingUnifier::unifiableSymbols
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
      Lib::Option<Kernel::SymbolId>::~Option((Option<Kernel::SymbolId> *)0x41178b);
      bVar1 = Lib::Option::operator_cast_to_bool
                        ((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                          *)0x411798);
      if (bVar1) {
        Lib::
        Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
        ::operator*((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                     *)0x4117b8);
        Lib::
        arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
                  (in_stack_fffffffffffffdb8);
        f._16_8_ = in_stack_fffffffffffffea0;
        f.n = (IntermediateNode *)in_stack_fffffffffffffe90._0_8_;
        f.top._inner._inner._0_1_ = in_stack_fffffffffffffe90[8];
        f.top._inner._inner._content[0] = in_stack_fffffffffffffe90[9];
        f.top._inner._inner._content[1] = in_stack_fffffffffffffe90[10];
        f.top._inner._inner._content[2] = in_stack_fffffffffffffe90[0xb];
        f.top._inner._inner._content[3] = in_stack_fffffffffffffe90[0xc];
        f.top._inner._inner._content[4] = in_stack_fffffffffffffe90[0xd];
        f.top._inner._inner._content[5] = in_stack_fffffffffffffe90[0xe];
        f.top._inner._inner._content[6] = in_stack_fffffffffffffe90[0xf];
        this = local_30;
        it = local_30;
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>>
        ::
        map<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_>
                  ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>_>
                    *)in_stack_fffffffffffffe78,f);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::{lambda(auto:1)#1},unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::{lambda(auto:1)#1},Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>
        ::
        filter<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_>
                  (local_150,&stack0xfffffffffffffe70);
        (**(code **)(*local_10 + 0x48))(local_1e0);
        Lib::
        concatIters<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>
                  ((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>
                    *)in_stack_fffffffffffffea8,
                   (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
                    *)in_stack_fffffffffffffea0);
        Lib::
        pvi<Lib::IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>,unsigned_long>(Lib::Recycled<Lib::Stack<unsigned_int>,Lib::DefaultReset,Lib::DefaultKeepRecycled>&&,unsigned_long)::_lambda(auto:1)_1_,unsigned_int>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>,Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>::_selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::IntermediateNode*,Kernel::AbstractingUnifier&,unsigned_int)::_lambda(auto:1)_2_,false>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node**>>>>>
                  (it);
        Lib::
        IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
        ::~IterTraits((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>_>
                       *)0x41189e);
        Lib::
        VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
                            *)this);
        Lib::
        IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1540:33),_false>_>
        ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1540:33),_false>_>
                       *)0x4118b5);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
        ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:1539:33),_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>
                       *)0x4118c2);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_unsigned_int>_>
        ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_unsigned_int>_>
                       *)0x4118cf);
      }
      else {
        (**(code **)(*local_10 + 0x40))(in_RDI);
      }
      Lib::
      Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
      ::~Option((Option<Lib::Recycled<Lib::Stack<unsigned_int>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                 *)0x4119f7);
    }
  }
  else {
    Kernel::AbstractingUnifier::subs((AbstractingUnifier *)0x411a22);
    __selectPotentiallyUnifiableChildren<Inferences::ALASCA::FourierMotzkinConf::Rhs>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  return (NodeIterator)in_RDI;
}

Assistant:

static typename SubstitutionTree<LD>::NodeIterator _selectPotentiallyUnifiableChildren(typename SubstitutionTree<LD>::IntermediateNode* n, AbstractingUnifier& unif, unsigned normInternalBank)
        {
          if (unif.usesUwa()) {
            unsigned specVar = n->childVar;
            auto top = unif.subs().getSpecialVarTop(specVar, normInternalBank);

            if(top.var()) {
              return n->allChildren();
            } else {
              auto syms = unif.unifiableSymbols(*top.functor());
              if (syms) {
                return pvi(concatIters(
                      arrayIter(std::move(*syms))
                        .map   ([=](auto f) { return n->childByTop(top, /* canCreate */ false); })
                        .filter([ ](auto n) { return n != nullptr; }),
                      n->variableChildren()
                      ));
              } else {
                return n->allChildren();
              }
            }
          } else {
            return __selectPotentiallyUnifiableChildren<LD>(n, unif.subs(), normInternalBank);
          }
        }